

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int128.cpp
# Opt level: O2

double __thiscall Omega_h::Int128::to_double(Int128 *this,double unit)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  lVar1 = this->high;
  uVar2 = this->low;
  uVar3 = -uVar2;
  lVar4 = -lVar1 - (ulong)(uVar2 != 0);
  if (-1 < lVar1) {
    uVar3 = uVar2;
    lVar4 = lVar1;
  }
  for (; lVar4 != 0; lVar4 = lVar4 >> 1) {
    uVar3 = uVar3 >> 1 | lVar4 << 0x3f;
    unit = unit + unit;
  }
  auVar6._8_4_ = (int)(uVar3 >> 0x20);
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = 0x45300000;
  dVar5 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
  if (lVar1 < 0) {
    dVar5 = -dVar5;
  }
  return unit * dVar5;
}

Assistant:

double Int128::to_double(double unit) const {
  Int128 tmp = *this;
  if (tmp < Int128(0)) tmp = -tmp;
  while (tmp.high) {
    tmp = tmp >> 1;
    unit *= 2;
  }
  double x = tmp.low;
  if (*this < Int128(0)) x = -x;
  x *= unit;
  return x;
}